

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptMath.cpp
# Opt level: O1

Var Js::JavascriptMath::Divide_Full(Var aLeft,Var aRight,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  Var pvVar3;
  uint64 uVar4;
  uint64 uVar5;
  undefined4 *puVar6;
  double value;
  
  bVar2 = TaggedInt::IsPair(aLeft,aRight);
  if (bVar2) {
    pvVar3 = TaggedInt::Divide(aLeft,aRight,scriptContext);
    return pvVar3;
  }
  value = Divide_Helper(aLeft,aRight,scriptContext);
  uVar4 = NumberUtilities::ToSpecial(value);
  bVar2 = NumberUtilities::IsNan(value);
  if (bVar2) {
    uVar5 = NumberUtilities::ToSpecial(value);
    if (uVar5 != 0xfff8000000000000) {
      uVar5 = NumberUtilities::ToSpecial(value);
      if (uVar5 != 0x7ff8000000000000) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar6 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.inl"
                                    ,0xa2,
                                    "(!IsNan(value) || ToSpecial(value) == k_NegativeNan || ToSpecial(value) == 0x7FF8000000000000ull)"
                                    ,"We should only produce a NaN with this value");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar6 = 0;
      }
    }
  }
  return (Var)(uVar4 ^ 0xfffc000000000000);
}

Assistant:

Var JavascriptMath::Divide_Full(Var aLeft,Var aRight, ScriptContext* scriptContext)
        {
            JIT_HELPER_REENTRANT_HEADER(Op_Divide_Full);
            // If both arguments are TaggedInt, then try to do integer division
            // This case is not handled by the lowerer.
            if (TaggedInt::IsPair(aLeft, aRight))
            {
                return TaggedInt::Divide(aLeft, aRight, scriptContext);
            }

            return JavascriptNumber::NewInlined( Divide_Helper(aLeft, aRight, scriptContext), scriptContext );
            JIT_HELPER_END(Op_Divide_Full);
        }